

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::BinaryExpr<const_std::basic_string_view<char,_std::char_traits<char>_>_&,_const_char_(&)[4]>
::streamReconstructedExpression
          (BinaryExpr<const_std::basic_string_view<char,_std::char_traits<char>_>_&,_const_char_(&)[4]>
           *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  char *in_RCX;
  string *in_R9;
  string_view str_00;
  StringRef op;
  string local_60;
  string local_40;
  char *str;
  
  str_00._M_str = in_RCX;
  str_00._M_len = (size_t)this->m_lhs->_M_str;
  StringMaker<std::basic_string_view<char,std::char_traits<char>>,void>::convert_abi_cxx11_
            (&local_40,(void *)this->m_lhs->_M_len,str_00);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  StringMaker<char[4],void>::convert_abi_cxx11_
            (&local_60,(StringMaker<char[4],void> *)this->m_rhs,str);
  op.m_size = (size_type)&local_60;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_40,lhs,op,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }